

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O2

void __thiscall ObjLoader::loadBinaryFile(ObjLoader *this,string *filename)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  pointer pSVar2;
  int32 iVar3;
  int32 iVar4;
  int32 iVar5;
  int32 iVar6;
  bool bVar7;
  int iVar8;
  NamedTextureImages *this_00;
  uchar *puVar9;
  mapped_type *pmVar10;
  size_t __nbytes;
  size_t __nbytes_00;
  size_t __nbytes_01;
  size_t __nbytes_02;
  size_t __nbytes_03;
  size_t __nbytes_04;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t __nbytes_05;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t sVar11;
  size_t __nbytes_06;
  size_t __nbytes_07;
  size_t __nbytes_08;
  size_t __nbytes_09;
  size_t extraout_RDX_04;
  IBO *ibo;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  pointer pSVar12;
  int32 value;
  ObjLoader *local_3a0;
  uint64_t count;
  string magic;
  string name;
  ifstream file;
  char magicBuffer [255];
  
  local_3a0 = this;
  std::ifstream::ifstream(&file,(filename->_M_dataplus)._M_p,_S_in);
  memset(magicBuffer,0,0xff);
  std::istream::read((char *)&file,(long)magicBuffer);
  iVar8 = bcmp(magicBuffer,"GLITTER_BIN_OBJ\n",0x11);
  if (iVar8 != 0) {
    __assert_fail("!strcmp(magicBuffer, GLITTER_BINFILE_MAGIC) && \"ObjLoader::loadBinaryFile(): Wrong file magic number\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x110,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  magic._M_dataplus._M_p = (pointer)&magic.field_2;
  magic._M_string_length = 0;
  magic.field_2._M_local_buf[0] = '\0';
  read((int)&magic,&file,__nbytes);
  bVar7 = std::operator==(&magic,"[VertexPositions]");
  if (!bVar7) {
    __assert_fail("(magic == \"[VertexPositions]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x115,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<3,float,(glm::qualifier)0>>(&local_3a0->m_vertexPositions,(istream *)&file);
  read((int)&magic,&file,__nbytes_00);
  bVar7 = std::operator==(&magic,"[VertexColors]");
  if (!bVar7) {
    __assert_fail("(magic == \"[VertexColors]\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x119,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<4,float,(glm::qualifier)0>>(&local_3a0->m_vertexColors,(istream *)&file);
  read((int)&magic,&file,__nbytes_01);
  bVar7 = std::operator==(&magic,"[VertexUVs]");
  if (!bVar7) {
    __assert_fail("(magic == \"[VertexUVs]\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x11d,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<2,float,(glm::qualifier)0>>(&local_3a0->m_vertexUVs,(istream *)&file);
  read((int)&magic,&file,__nbytes_02);
  bVar7 = std::operator==(&magic,"[VertexNormals]");
  if (!bVar7) {
    __assert_fail("(magic == \"[VertexNormals]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x121,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<3,float,(glm::qualifier)0>>(&local_3a0->m_vertexNormals,(istream *)&file);
  read((int)&magic,&file,__nbytes_03);
  bVar7 = std::operator==(&magic,"[VertexTangents]");
  if (!bVar7) {
    __assert_fail("(magic == \"[VertexTangents]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x125,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<3,float,(glm::qualifier)0>>(&local_3a0->m_vertexTangents,(istream *)&file);
  read((int)&magic,&file,__nbytes_04);
  bVar7 = std::operator==(&magic,"[IBOS]");
  if (!bVar7) {
    __assert_fail("(magic == \"[IBOS]\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x129,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<unsigned_long>(&count,(istream *)&file);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&local_3a0->m_ibos,count);
  pvVar1 = (local_3a0->m_ibos).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar11 = extraout_RDX;
  for (v = (local_3a0->m_ibos).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start; v != pvVar1; v = v + 1) {
    read<unsigned_int>(v,(istream *)&file);
    sVar11 = extraout_RDX_00;
  }
  read((int)&magic,&file,sVar11);
  bVar7 = std::operator==(&magic,"[NamedTextureImages]");
  if (bVar7) {
    read<unsigned_long>(&count,(istream *)&file);
    this_00 = &local_3a0->m_images;
    sVar11 = extraout_RDX_01;
    while( true ) {
      bVar7 = count == 0;
      count = count - 1;
      if (bVar7) {
        read((int)&magic,&file,sVar11);
        bVar7 = std::operator==(&magic,"[SimpleMaterials]");
        if (!bVar7) {
          __assert_fail("(magic == \"[SimpleMaterials]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                        ,0x14c,"void ObjLoader::loadBinaryFile(const std::string &)");
        }
        read<unsigned_long>(&count,(istream *)&file);
        std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::resize
                  (&local_3a0->m_materials,count);
        pSVar12 = (local_3a0->m_materials).
                  super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar2 = (local_3a0->m_materials).
                 super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        sVar11 = extraout_RDX_03;
        while( true ) {
          if (pSVar12 == pSVar2) {
            std::__cxx11::string::~string((string *)&magic);
            std::ifstream::~ifstream(&file);
            return;
          }
          read((int)&magic,(istream *)&file,sVar11);
          bVar7 = std::operator==(&magic,"_Material_");
          if (!bVar7) break;
          iVar8 = (int)pSVar12;
          read(iVar8,(istream *)&file,__nbytes_06);
          read<glm::vec<3,float,(glm::qualifier)0>>(&pSVar12->ambient,(istream *)&file);
          read<glm::vec<3,float,(glm::qualifier)0>>(&pSVar12->diffuse,(istream *)&file);
          read<glm::vec<3,float,(glm::qualifier)0>>(&pSVar12->specular,(istream *)&file);
          read<float>(&pSVar12->shininess,(istream *)&file);
          read(iVar8 + 0x48,(istream *)&file,__nbytes_07);
          read(iVar8 + 0x68,(istream *)&file,__nbytes_08);
          read(iVar8 + 0x88,(istream *)&file,__nbytes_09);
          pSVar12 = pSVar12 + 1;
          sVar11 = extraout_RDX_04;
        }
        __assert_fail("(magic == \"_Material_\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                      ,0x152,"void ObjLoader::loadBinaryFile(const std::string &)");
      }
      read((int)&magic,(istream *)&file,sVar11);
      bVar7 = std::operator==(&magic,"_Image_");
      if (!bVar7) break;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      read((int)&name,(istream *)&file,__nbytes_05);
      read<int>(&value,(istream *)&file);
      iVar3 = value;
      read<int>(&value,(istream *)&file);
      iVar4 = value;
      read<int>(&value,(istream *)&file);
      iVar5 = value;
      read<int>(&value,(istream *)&file);
      iVar6 = value;
      puVar9 = (uchar *)operator_new__((long)(iVar5 * value * iVar4 * iVar3));
      std::istream::read((char *)&file,(long)puVar9);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,&name);
      pmVar10->width = iVar3;
      pmVar10->height = iVar4;
      pmVar10->depth = iVar5;
      pmVar10->channels = iVar6;
      pmVar10->data = puVar9;
      std::__cxx11::string::~string((string *)&name);
      sVar11 = extraout_RDX_02;
    }
    __assert_fail("(magic == \"_Image_\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x138,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  __assert_fail("(magic == \"[NamedTextureImages]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                ,0x133,"void ObjLoader::loadBinaryFile(const std::string &)");
}

Assistant:

void ObjLoader::loadBinaryFile(const std::string & filename)
{
  std::ifstream file(filename.c_str());
  char magicBuffer[255];
  memset(magicBuffer, 0, 255);
  file.read(magicBuffer, strlen(GLITTER_BINFILE_MAGIC));
  assert(!strcmp(magicBuffer, GLITTER_BINFILE_MAGIC) && "ObjLoader::loadBinaryFile(): Wrong file magic number");

  std::string magic;

  read(magic, file);
  assert((magic == "[VertexPositions]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexPositions, file);

  read(magic, file);
  assert((magic == "[VertexColors]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexColors, file);

  read(magic, file);
  assert((magic == "[VertexUVs]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexUVs, file);

  read(magic, file);
  assert((magic == "[VertexNormals]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexNormals, file);

  read(magic, file);
  assert((magic == "[VertexTangents]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexTangents, file);

  read(magic, file);
  assert((magic == "[IBOS]") && "ObjLoader::loadBinaryFile(): Tag not found");
  // IBOs
  std::uint64_t count;
  read(count, file);
  m_ibos.resize(count);
  for (IBO & ibo : m_ibos) {
    read(ibo, file);
  }

  read(magic, file);
  assert((magic == "[NamedTextureImages]") && "ObjLoader::loadBinaryFile(): Tag not found");
  // NamedTextureImages m_images;
  read(count, file);
  while (count--) {
    read(magic, file);
    assert((magic == "_Image_") && "ObjLoader::loadBinaryFile(): Tag not found");
    std::string name;
    read(name, file);
    Image<> image;
    glm::int32 value;
    read(value, file);
    image.width = value;
    read(value, file);
    image.height = value;
    read(value, file);
    image.depth = value;
    read(value, file);
    image.channels = value;
    size_t dataSize = image.width * image.height * image.depth * image.channels;
    image.data = new Image<>::value_type[dataSize];
    file.read(reinterpret_cast<char *>(image.data), dataSize * sizeof(Image<>::value_type));
    m_images.add(name, image);
  }

  read(magic, file);
  assert((magic == "[SimpleMaterials]") && "ObjLoader::loadBinaryFile(): Tag not found");
  // std::vector<SimpleMaterial> m_materials;
  read(count, file);
  m_materials.resize(count);
  for (SimpleMaterial & material : m_materials) {
    read(magic, file);
    assert((magic == "_Material_") && "ObjLoader::loadBinaryFile(): Tag not found");
    read(material.name, file);
    read(material.ambient, file);
    read(material.diffuse, file);
    read(material.specular, file);
    read(material.shininess, file);
    read(material.diffuseTexName, file);
    read(material.normalTexName, file);
    read(material.specularTexName, file);
  }
}